

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = cParams->windowLog;
  uVar3 = params->minMatchLength;
  if (uVar3 == 0) {
    params->minMatchLength = 0x40;
    uVar3 = 0x40;
  }
  if (ZSTD_btlazy2 < cParams->strategy) {
    if (uVar3 < cParams->targetLength) {
      uVar3 = cParams->targetLength;
    }
    params->minMatchLength = uVar3;
  }
  uVar3 = params->hashLog;
  if (uVar3 == 0) {
    uVar3 = 6;
    if (6 < uVar2 - 7) {
      uVar3 = uVar2 - 7;
    }
    params->hashLog = uVar3;
  }
  if (params->hashEveryLog == 0) {
    UVar1 = uVar2 - uVar3;
    if (uVar2 < uVar3) {
      UVar1 = 0;
    }
    params->hashEveryLog = UVar1;
  }
  uVar2 = 3;
  if (params->bucketSizeLog != 0) {
    uVar2 = params->bucketSizeLog;
  }
  if (uVar3 <= uVar2) {
    uVar2 = uVar3;
  }
  params->bucketSizeLog = uVar2;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    U32 const windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (cParams->strategy >= ZSTD_btopt) {
      /* Get out of the way of the optimal parser */
      U32 const minMatch = MAX(cParams->targetLength, params->minMatchLength);
      assert(minMatch >= ZSTD_LDM_MINMATCH_MIN);
      assert(minMatch <= ZSTD_LDM_MINMATCH_MAX);
      params->minMatchLength = minMatch;
    }
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashEveryLog == 0) {
        params->hashEveryLog =
                windowLog < params->hashLog ? 0 : windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}